

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(FeatureDescription *a,FeatureDescription *b)

{
  bool bVar1;
  undefined1 *b_00;
  undefined1 *a_00;
  
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(a->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(b->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  if ((!bVar1) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(a->shortdescription_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(b->shortdescription_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
     , !bVar1)) {
    a_00 = (undefined1 *)a->type_;
    if ((FeatureType *)a_00 == (FeatureType *)0x0) {
      a_00 = _FeatureType_default_instance_;
    }
    b_00 = (undefined1 *)b->type_;
    if ((FeatureType *)b_00 == (FeatureType *)0x0) {
      b_00 = _FeatureType_default_instance_;
    }
    bVar1 = operator!=((FeatureType *)a_00,(FeatureType *)b_00);
    return !bVar1;
  }
  return false;
}

Assistant:

bool operator==(const FeatureDescription& a,
                        const FeatureDescription& b) {
            if (a.name() != b.name()) {
                return false;
            }
            if (a.shortdescription() != b.shortdescription()) {
                return false;
            }
            if (a.type() != b.type()) {
                return false;
            }
            return true;
        }